

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

int __thiscall rsg::BlockStatement::init(BlockStatement *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  Random *this_00;
  ShaderParameters *pSVar2;
  VariableManager *this_01;
  GeneratorState *state_local;
  BlockStatement *this_local;
  
  this_00 = GeneratorState::getRandom((GeneratorState *)ctx);
  pSVar2 = GeneratorState::getShaderParameters((GeneratorState *)ctx);
  iVar1 = de::Random::getInt(this_00,0,pSVar2->maxStatementsPerBlock);
  this->m_numChildrenToCreate = iVar1;
  this_01 = GeneratorState::getVariableManager((GeneratorState *)ctx);
  VariableManager::pushVariableScope(this_01,&this->m_scope);
  return extraout_EAX;
}

Assistant:

void BlockStatement::init (GeneratorState& state)
{
	// Select number of children statements to construct
	m_numChildrenToCreate = state.getRandom().getInt(0, state.getShaderParameters().maxStatementsPerBlock);

	// Push scope
	state.getVariableManager().pushVariableScope(m_scope);
}